

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

dtl_sv_t * dtl_sv_to_sv(dtl_sv_t *self)

{
  dtl_sv_t *dv_00;
  dtl_sv_type_id dVar1;
  dtl_dv_type_id dVar2;
  dtl_dv_t *dv;
  dtl_sv_t *self_local;
  
  if ((self != (dtl_sv_t *)0x0) && (dVar1 = dtl_sv_type(self), dVar1 == DTL_SV_DV)) {
    dv_00 = (dtl_sv_t *)(self->pAny->val).dv;
    dVar2 = dtl_dv_type((dtl_dv_t *)dv_00);
    if (dVar2 == DTL_DV_SCALAR) {
      return dv_00;
    }
  }
  return (dtl_sv_t *)0x0;
}

Assistant:

dtl_sv_t *dtl_sv_to_sv(const dtl_sv_t *self)
{
   if(self != 0)
   {
      if(dtl_sv_type(self) == DTL_SV_DV)
      {
         dtl_dv_t *dv = self->pAny->val.dv;
         if (dtl_dv_type(dv) == DTL_DV_SCALAR )
         {
            return (dtl_sv_t*) dv;
         }
      }
   }
   return (dtl_sv_t*) 0;
}